

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastops_ut.cpp
# Opt level: O2

void UnitTestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(void)

{
  char cVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  TTestExpOpts opts;
  undefined1 auVar4 [56];
  TTestExpOpts opts_00;
  TTestExpOpts opts_01;
  TTestExpOpts opts_02;
  TTestExpOpts opts_03;
  TTestExpOpts opts_04;
  TTestExpOpts opts_05;
  TTestExpOpts opts_06;
  TTestExpOpts opts_07;
  uint *puVar5;
  undefined8 *puVar6;
  result_type rVar7;
  result_type rVar8;
  ostream *poVar9;
  FastOpsTestException *this;
  size_t i_2;
  long lVar10;
  undefined1 uVar11;
  undefined8 uVar12;
  size_t i;
  long lVar13;
  undefined2 local_e34;
  char local_e32 [2];
  float out;
  float in;
  undefined8 *local_e28;
  uint local_e10;
  uint local_e0c;
  uint local_e08;
  uint local_e04;
  uint local_e00;
  uint local_dfc;
  uint local_df8;
  uint local_df4;
  long local_df0;
  long local_de8;
  undefined8 *local_de0;
  undefined4 local_dd8;
  undefined4 uStack_dd4;
  undefined4 uStack_dd0;
  undefined4 uStack_dcc;
  undefined8 local_dc8;
  long lStack_dc0;
  undefined8 local_db8;
  long lStack_db0;
  long local_da8;
  undefined1 uStack_da0;
  undefined1 uStack_d9f;
  undefined6 uStack_d9e;
  undefined4 local_d98;
  undefined4 uStack_d94;
  undefined4 uStack_d90;
  undefined4 uStack_d8c;
  undefined8 local_d88;
  long lStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined1 uStack_d60;
  undefined1 uStack_d5f;
  undefined6 uStack_d5e;
  undefined4 local_d58;
  undefined4 uStack_d54;
  undefined4 uStack_d50;
  undefined4 uStack_d4c;
  undefined8 local_d48;
  long lStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 uStack_d20;
  undefined1 uStack_d1f;
  undefined6 uStack_d1e;
  undefined4 local_d18;
  undefined4 uStack_d14;
  undefined4 uStack_d10;
  undefined4 uStack_d0c;
  undefined8 local_d08;
  long lStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined2 uStack_ce0;
  undefined6 uStack_cde;
  undefined4 local_cd8;
  undefined4 uStack_cd4;
  undefined4 uStack_cd0;
  undefined4 uStack_ccc;
  undefined8 local_cc8;
  long lStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 uStack_ca0;
  undefined1 uStack_c9f;
  undefined6 uStack_c9e;
  string local_c98;
  undefined4 local_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined1 uStack_c50;
  undefined7 uStack_c4f;
  undefined1 uStack_c48;
  undefined7 uStack_c47;
  undefined1 uStack_c40;
  undefined1 uStack_c3f;
  undefined6 uStack_c3e;
  undefined4 local_c38;
  undefined4 uStack_c34;
  undefined4 uStack_c30;
  undefined4 uStack_c2c;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined1 uStack_c10;
  undefined7 uStack_c0f;
  undefined1 uStack_c08;
  undefined7 uStack_c07;
  undefined1 uStack_c00;
  undefined1 uStack_bff;
  undefined6 uStack_bfe;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined1 uStack_bd0;
  undefined7 uStack_bcf;
  undefined1 uStack_bc8;
  undefined7 uStack_bc7;
  undefined1 uStack_bc0;
  undefined1 uStack_bbf;
  undefined6 uStack_bbe;
  undefined4 local_bb8;
  undefined4 uStack_bb4;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  undefined8 local_ba8;
  long lStack_ba0;
  undefined8 local_b98;
  undefined1 uStack_b90;
  undefined7 uStack_b8f;
  undefined1 uStack_b88;
  undefined7 uStack_b87;
  undefined1 uStack_b80;
  undefined1 uStack_b7f;
  undefined6 uStack_b7e;
  ostringstream out_1;
  mt19937_64 rng;
  
  local_e32[0] = '\0';
  local_e32[1] = '\x01';
  local_df0 = 0;
  do {
    if (local_df0 == 2) {
      return;
    }
    cVar1 = local_e32[local_df0];
    local_e34 = 0x100;
    local_de8 = 0;
    while( true ) {
      if (local_de8 == 2) break;
      uVar2 = *(undefined1 *)((long)&local_e34 + local_de8);
      if (cVar1 == '\0') {
        local_e04 = MXCSR;
        local_e08 = MXCSR | 0x8000;
        local_e0c = MXCSR | 0x8000;
        local_e10 = MXCSR | 0x8040;
        puVar5 = &local_e10;
      }
      else {
        local_df4 = MXCSR;
        local_df8 = MXCSR & 0xffff7fff;
        local_dfc = MXCSR & 0xffff7fff;
        local_e00 = MXCSR & 0xffff7fbf;
        puVar5 = &local_e00;
      }
      MXCSR = *puVar5;
      std::
      mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
      ::seed(&rng,0xf);
      in = 2.0;
      out = 2.0;
      NFastOps::TanhAvx<false,false>(&in,0,&out);
      if ((((in != 2.0) || (NAN(in))) || (out != 2.0)) || (NAN(out))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&out_1);
        poVar9 = std::operator<<((ostream *)&out_1,"assertion failed ");
        poVar9 = std::operator<<(poVar9,"in == 2 && out == 2");
        poVar9 = std::operator<<(poVar9," at ");
        poVar9 = std::operator<<(poVar9,"UnitTestFunc");
        poVar9 = std::operator<<(poVar9,", ");
        poVar9 = std::operator<<(poVar9,
                                 "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        std::ostream::operator<<(poVar9,0x11c);
        this = (FastOpsTestException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        FastOpsTestException::FastOpsTestException(this,&local_c98);
        __cxa_throw(this,&FastOpsTestException::typeinfo,FastOpsTestException::~FastOpsTestException
                   );
      }
      NFastOps::TanhAvx<false,false>((float *)0x0,0,(float *)0x0);
      for (lVar13 = 1; lVar13 != 500; lVar13 = lVar13 + 1) {
        uStack_d30 = 0;
        uStack_d28 = 0;
        local_d58 = 3;
        uStack_d54 = 0xc0400000;
        uStack_d50 = 0x40400000;
        local_d48 = 2000;
        local_d38 = 0x32;
        uStack_d20 = 1;
        opts.Inplace = (bool)uVar2;
        opts.IsRandom = true;
        opts._58_6_ = uStack_d1e;
        auVar4 = ZEXT4056(CONCAT832(0x32,CONCAT824(lVar13,CONCAT816(2000,CONCAT88(CONCAT44(
                                                  uStack_d4c,0x40400000),0xc040000000000003)))));
        opts.Func = auVar4._0_4_;
        opts.Min = (float)auVar4._4_4_;
        opts.Max = (float)auVar4._8_4_;
        opts._12_4_ = auVar4._12_4_;
        opts.N = auVar4._16_8_;
        opts.VecSize = auVar4._24_8_;
        opts.PadSize = auVar4._32_8_;
        opts.InputAlignBytes = auVar4._40_8_;
        opts.OutputAlignBytes = auVar4._48_8_;
        lStack_d40 = lVar13;
        uStack_d1f = uVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts);
      }
      for (lVar13 = 1; lVar13 != 500; lVar13 = lVar13 + 1) {
        uStack_cb0 = 0;
        uStack_ca8 = 0;
        uStack_ca0 = 0;
        local_cd8 = 3;
        uStack_cd4 = 0xc1a00000;
        uStack_cd0 = 0x41a00000;
        local_cc8 = 2000;
        local_cb8 = 0x32;
        lVar10 = (ulong)CONCAT61(uStack_c9e,uVar2) << 8;
        auVar4 = ZEXT4056(CONCAT832(0x32,CONCAT824(lVar13,CONCAT816(2000,CONCAT88(CONCAT44(
                                                  uStack_ccc,0x41a00000),0xc1a0000000000003)))));
        opts_00.IsRandom = (bool)(char)lVar10;
        opts_00.Inplace = (bool)(char)((ulong)lVar10 >> 8);
        opts_00._58_6_ = (int6)((ulong)lVar10 >> 0x10);
        opts_00.Func = auVar4._0_4_;
        opts_00.Min = (float)auVar4._4_4_;
        opts_00.Max = (float)auVar4._8_4_;
        opts_00._12_4_ = auVar4._12_4_;
        opts_00.N = auVar4._16_8_;
        opts_00.VecSize = auVar4._24_8_;
        opts_00.PadSize = auVar4._32_8_;
        opts_00.InputAlignBytes = auVar4._40_8_;
        opts_00.OutputAlignBytes = auVar4._48_8_;
        lStack_cc0 = lVar13;
        uStack_c9f = uVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_00);
      }
      _out_1 = (undefined8 *)0x0;
      for (local_c98._M_dataplus._M_p = (pointer)0x1; local_c98._M_dataplus._M_p < (pointer)0x20;
          local_c98._M_dataplus._M_p = local_c98._M_dataplus._M_p + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&out_1,
                   (value_type_conflict1 *)&local_c98);
      }
      local_e28 = (undefined8 *)0x0;
      uVar12 = 0;
      for (puVar6 = _out_1; puVar6 != local_e28; puVar6 = puVar6 + 1) {
        uVar3 = *puVar6;
        for (lVar13 = 1; lVar13 != 200; lVar13 = lVar13 + 1) {
          local_d18 = 3;
          uStack_d14 = 0xc1a00000;
          uStack_d10 = 0x41a00000;
          local_d08 = 1000;
          local_cf8 = 0x32;
          local_ce8 = 0;
          uStack_ce0 = 1;
          opts_01._12_4_ = uStack_d0c;
          opts_01.Max = 20.0;
          opts_01._58_6_ = uStack_cde;
          opts_01.IsRandom = true;
          opts_01.Inplace = false;
          opts_01.Func = Tanh;
          opts_01.Min = -20.0;
          opts_01.N = 1000;
          opts_01.VecSize = lVar13;
          opts_01.PadSize = 0x32;
          opts_01.InputAlignBytes = uVar3;
          opts_01.OutputAlignBytes = 0;
          lStack_d00 = lVar13;
          uStack_cf0 = uVar3;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_01);
          uVar12 = uVar3;
        }
      }
      local_de0 = (undefined8 *)0x0;
      uVar11 = 0;
      puVar6 = _out_1;
      while (puVar6 != local_de0) {
        uVar3 = *puVar6;
        local_e28 = puVar6;
        for (lVar13 = 1; lVar13 != 200; lVar13 = lVar13 + 1) {
          local_d98 = 3;
          uStack_d94 = 0xc1a00000;
          uStack_d90 = 0x41a00000;
          local_d88 = 1000;
          local_d78 = 0x32;
          uStack_d60 = 1;
          opts_02._12_4_ = uStack_d8c;
          opts_02.Max = 20.0;
          opts_02.Inplace = (bool)uVar2;
          opts_02.IsRandom = true;
          opts_02._58_6_ = uStack_d5e;
          opts_02.Func = Tanh;
          opts_02.Min = -20.0;
          opts_02.N = 1000;
          opts_02.VecSize = lVar13;
          opts_02.PadSize = 0x32;
          opts_02.InputAlignBytes = uVar12;
          opts_02.OutputAlignBytes = uVar3;
          lStack_d80 = lVar13;
          uStack_d70 = uVar12;
          local_d68 = uVar3;
          uStack_d5f = uVar2;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_02);
          uVar11 = uVar2;
        }
        puVar6 = local_e28 + 1;
      }
      for (lVar13 = 0; lVar13 != 0x1e; lVar13 = lVar13 + 1) {
        for (lVar10 = 1; lVar10 != 100; lVar10 = lVar10 + 1) {
          rVar7 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()(&rng);
          rVar8 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()(&rng);
          lStack_db0 = rVar7 % 0x1f + 1;
          local_da8 = rVar8 % 0x1f + 1;
          local_dd8 = 3;
          uStack_dd4 = 0xc1a00000;
          uStack_dd0 = 0x41a00000;
          local_dc8 = 1000;
          local_db8 = 0x32;
          uStack_da0 = 1;
          opts_03._12_4_ = uStack_dcc;
          opts_03.Max = 20.0;
          opts_03.Inplace = (bool)uVar11;
          opts_03.IsRandom = true;
          opts_03._58_6_ = uStack_d9e;
          opts_03.Func = Tanh;
          opts_03.Min = -20.0;
          opts_03.N = 1000;
          opts_03.VecSize = lVar10;
          opts_03.PadSize = 0x32;
          opts_03.InputAlignBytes = lStack_db0;
          opts_03.OutputAlignBytes = local_da8;
          lStack_dc0 = lVar10;
          uStack_d9f = uVar11;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_03);
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&out_1);
      for (lVar13 = 1; lVar13 != 200; lVar13 = lVar13 + 1) {
        uStack_b88 = 0;
        uStack_b87 = 0;
        uStack_b80 = 0;
        local_b98 = 0;
        uStack_b90 = 0;
        uStack_b8f = 0;
        local_bb8 = 3;
        uStack_bb4 = 0xc1a00000;
        uStack_bb0 = 0x41a00000;
        local_ba8 = 10000;
        lVar10 = (ulong)CONCAT61(uStack_b7e,uVar2) << 8;
        auVar4 = ZEXT3256(CONCAT824(lVar13,CONCAT816(10000,CONCAT88(CONCAT44(uStack_bac,0x41a00000),
                                                                    0xc1a0000000000003))));
        opts_04.IsRandom = (bool)(char)lVar10;
        opts_04.Inplace = (bool)(char)((ulong)lVar10 >> 8);
        opts_04._58_6_ = (int6)((ulong)lVar10 >> 0x10);
        opts_04.Func = auVar4._0_4_;
        opts_04.Min = (float)auVar4._4_4_;
        opts_04.Max = (float)auVar4._8_4_;
        opts_04._12_4_ = auVar4._12_4_;
        opts_04.N = auVar4._16_8_;
        opts_04.VecSize = auVar4._24_8_;
        opts_04.PadSize = auVar4._32_8_;
        opts_04.InputAlignBytes = auVar4._40_8_;
        opts_04.OutputAlignBytes = auVar4._48_8_;
        lStack_ba0 = lVar13;
        uStack_b7f = uVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_04);
      }
      local_bf8 = 3;
      uStack_bf4 = 0xc1a00000;
      uStack_bf0 = 0x41a00000;
      local_be8 = 5000000;
      uStack_be0 = 0x10;
      uStack_bc8 = 0;
      uStack_bc7 = 0;
      uStack_bc0 = 0;
      local_bd8 = 0;
      uStack_bd0 = 0;
      uStack_bcf = 0;
      lVar13 = (ulong)CONCAT61(uStack_bbe,uVar2) << 8;
      auVar4 = ZEXT3256(CONCAT824(0x10,CONCAT816(5000000,CONCAT88(CONCAT44(uStack_bec,0x41a00000),
                                                                  0xc1a0000000000003))));
      opts_05.IsRandom = (bool)(char)lVar13;
      opts_05.Inplace = (bool)(char)((ulong)lVar13 >> 8);
      opts_05._58_6_ = (int6)((ulong)lVar13 >> 0x10);
      opts_05.Func = auVar4._0_4_;
      opts_05.Min = (float)auVar4._4_4_;
      opts_05.Max = (float)auVar4._8_4_;
      opts_05._12_4_ = auVar4._12_4_;
      opts_05.N = auVar4._16_8_;
      opts_05.VecSize = auVar4._24_8_;
      opts_05.PadSize = auVar4._32_8_;
      opts_05.InputAlignBytes = auVar4._40_8_;
      opts_05.OutputAlignBytes = auVar4._48_8_;
      uStack_bbf = uVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_05);
      local_c38 = 3;
      uStack_c34 = 0xc0a00000;
      uStack_c30 = 0x40a00000;
      local_c28 = 5000000;
      uStack_c20 = 0x10;
      uStack_c08 = 0;
      uStack_c07 = 0;
      uStack_c00 = 0;
      local_c18 = 0;
      uStack_c10 = 0;
      uStack_c0f = 0;
      lVar13 = (ulong)CONCAT61(uStack_bfe,uVar2) << 8;
      auVar4 = ZEXT3256(CONCAT824(0x10,CONCAT816(5000000,CONCAT88(CONCAT44(uStack_c2c,0x40a00000),
                                                                  0xc0a0000000000003))));
      opts_06.IsRandom = (bool)(char)lVar13;
      opts_06.Inplace = (bool)(char)((ulong)lVar13 >> 8);
      opts_06._58_6_ = (int6)((ulong)lVar13 >> 0x10);
      opts_06.Func = auVar4._0_4_;
      opts_06.Min = (float)auVar4._4_4_;
      opts_06.Max = (float)auVar4._8_4_;
      opts_06._12_4_ = auVar4._12_4_;
      opts_06.N = auVar4._16_8_;
      opts_06.VecSize = auVar4._24_8_;
      opts_06.PadSize = auVar4._32_8_;
      opts_06.InputAlignBytes = auVar4._40_8_;
      opts_06.OutputAlignBytes = auVar4._48_8_;
      uStack_bff = uVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_06);
      local_c78 = 3;
      uStack_c74 = 0xb6a7c5ac;
      uStack_c70 = 0x36a7c5ac;
      local_c68 = 500000;
      uStack_c60 = 0x10;
      uStack_c48 = 0;
      uStack_c47 = 0;
      uStack_c40 = 0;
      local_c58 = 0;
      uStack_c50 = 0;
      uStack_c4f = 0;
      lVar13 = (ulong)CONCAT61(uStack_c3e,uVar2) << 8;
      auVar4 = ZEXT3256(CONCAT824(0x10,CONCAT816(500000,CONCAT88(CONCAT44(uStack_c6c,0x36a7c5ac),
                                                                 0xb6a7c5ac00000003))));
      opts_07.IsRandom = (bool)(char)lVar13;
      opts_07.Inplace = (bool)(char)((ulong)lVar13 >> 8);
      opts_07._58_6_ = (int6)((ulong)lVar13 >> 0x10);
      opts_07.Func = auVar4._0_4_;
      opts_07.Min = (float)auVar4._4_4_;
      opts_07.Max = (float)auVar4._8_4_;
      opts_07._12_4_ = auVar4._12_4_;
      opts_07.N = auVar4._16_8_;
      opts_07.VecSize = auVar4._24_8_;
      opts_07.PadSize = auVar4._32_8_;
      opts_07.InputAlignBytes = auVar4._40_8_;
      opts_07.OutputAlignBytes = auVar4._48_8_;
      uStack_c3f = uVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(&rng,opts_07);
      local_de8 = local_de8 + 1;
    }
    local_df0 = local_df0 + 1;
  } while( true );
}

Assistant:

void UnitTestFunc() {
    try {
        float min = -150;
        float max = 150;
        if (sizeof(T) != 4) {
            min = -1000;
            max = 1000;
        }

        if (TFunc::GetType() == EFunc::Sigmoid || TFunc::GetType() == EFunc::Tanh) {
            min = -20;
            max = 20;
        }

        for (bool enableDenormals : {false, true}) {
            for (bool inplace : {false, true}) {
                if (enableDenormals) {
                    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_OFF);
                    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_OFF);
                } else {
                    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
                    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);
                }

                std::mt19937_64 rng(15);
                // there should be no error on zero-size input
                {
                    T in = 2;
                    T out = 2;
                    TFunc::Apply(&in, 0, &out);
                    UNIT_ASSERT(in == 2 && out == 2);

                    TFunc::Apply((float*)nullptr, 0, (float*)nullptr);
                }

                // random test (near numbers must be vastly different)
                for (size_t i = 1; i < 500; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();

                    // othewise we will almost always get 1
                    if (TFunc::GetType() == EFunc::Sigmoid || TFunc::GetType() == EFunc::Tanh) {
                        opts.Min = -3;
                        opts.Max = 3;
                    }

                    opts.N = 2000;
                    opts.VecSize = i;
                    opts.PadSize = 50;
                    opts.IsRandom = true;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // roughly test precision + if there is no memory issues
                for (size_t i = 1; i < 500; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 2000;
                    opts.VecSize = i;
                    opts.PadSize = 50;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // roughly test precision + that there is no memory issues in an unaligned case
                if (!TFunc::Aligned) {
                    std::vector<size_t> alignments;
                    for (size_t i = 1; i < 32; ++i) {
                        alignments.push_back(i);
                    }
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 1000;
                    opts.IsRandom = true;
                    opts.PadSize = 50;
                    for (size_t alignment : alignments) {
                        for (size_t i = 1; i < 200; ++i) {
                            opts.VecSize = i;
                            opts.OutputAlignBytes = 0;
                            opts.InputAlignBytes = alignment;
                            TestFunc<TFunc, TCompare, T>(rng, opts);
                        }
                    }
                    if (!TFunc::Aligned) {
                        for (size_t alignment : alignments) {
                            for (size_t i = 1; i < 200; ++i) {
                                opts.VecSize = i;
                                opts.OutputAlignBytes = alignment;
                                opts.Inplace = inplace;
                                TestFunc<TFunc, TCompare, T>(rng, opts);
                            }
                        }
                        for (size_t iterIdx = 0; iterIdx < 30; ++iterIdx) {
                            (void)(iterIdx);
                            for (size_t i = 1; i < 100; ++i) {
                                opts.VecSize = i;
                                opts.InputAlignBytes = rng() % 31 + 1;
                                opts.OutputAlignBytes = rng() % 31 + 1;
                                TestFunc<TFunc, TCompare, T>(rng, opts);
                            }
                        }
                    }
                }

                // Test precision in more detail
                for (size_t i = 1; i < 200; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 10000;
                    opts.VecSize = i;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // Test precision in even more detail
                TTestExpOpts opts;
                opts.Func = TFunc::GetType();
                opts.Min = min;
                opts.Max = max;
                opts.N = 5000000;
                opts.VecSize = 16;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);

                opts.Min = -5;
                opts.Max = 5;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);

                // analyze behavior near zero
                opts.Min = -0.000005;
                opts.Max = 0.000005;
                opts.N = 500000;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);
            }
        }
    } catch (...) {
        _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_OFF);
        _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_OFF);
        throw;
    }
}